

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManEquivCountOne(Gia_Man_t *p,int i)

{
  int iVar1;
  long lVar2;
  
  iVar1 = Gia_ObjIsHead(p,i);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x1c0,"int Gia_ManEquivCountOne(Gia_Man_t *, int)");
  }
  lVar2 = (long)i;
  iVar1 = 1;
  while( true ) {
    lVar2 = (long)p->pNexts[lVar2];
    if (lVar2 < 1) {
      return iVar1;
    }
    if (((uint)p->pReprs[lVar2] & 0xfffffff) != i) break;
    iVar1 = iVar1 + 1;
  }
  __assert_fail("Gia_ObjRepr(p, Ent) == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x1c2,"int Gia_ManEquivCountOne(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManEquivCountOne( Gia_Man_t * p, int i )
{
    int Ent, nLits = 1;
    Gia_ClassForEachObj1( p, i, Ent )
    {
        assert( Gia_ObjRepr(p, Ent) == i );
        nLits++;
    }
    return nLits;
}